

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_hash.c
# Opt level: O0

void * ngx_hash_find_wc_tail(ngx_hash_wildcard_t *hwc,u_char *name,size_t len)

{
  ngx_hash_wildcard_t *hwc_00;
  ngx_uint_t local_40;
  ngx_uint_t key;
  ngx_uint_t i;
  void *value;
  size_t len_local;
  u_char *name_local;
  ngx_hash_wildcard_t *hwc_local;
  
  local_40 = 0;
  for (key = 0; (key < len && (name[key] != '.')); key = key + 1) {
    local_40 = local_40 * 0x1f + (ulong)name[key];
  }
  if (key == len) {
    hwc_local = (ngx_hash_wildcard_t *)0x0;
  }
  else {
    hwc_local = (ngx_hash_wildcard_t *)ngx_hash_find(&hwc->hash,local_40,name,key);
    if (hwc_local == (ngx_hash_wildcard_t *)0x0) {
      hwc_local = (ngx_hash_wildcard_t *)hwc->value;
    }
    else if (((ulong)hwc_local & 2) != 0) {
      hwc_00 = (ngx_hash_wildcard_t *)((ulong)hwc_local & 0xfffffffffffffffc);
      hwc_local = (ngx_hash_wildcard_t *)
                  ngx_hash_find_wc_tail(hwc_00,name + key + 1,len - (key + 1));
      if (hwc_local == (ngx_hash_wildcard_t *)0x0) {
        hwc_local = (ngx_hash_wildcard_t *)hwc_00->value;
      }
    }
  }
  return hwc_local;
}

Assistant:

void *
ngx_hash_find_wc_tail(ngx_hash_wildcard_t *hwc, u_char *name, size_t len)
{
    void        *value;
    ngx_uint_t   i, key;

#if 0
    ngx_log_error(NGX_LOG_ALERT, ngx_cycle->log, 0, "wct:\"%*s\"", len, name);
#endif

    key = 0;

    for (i = 0; i < len; i++) {
        if (name[i] == '.') {
            break;
        }

        key = ngx_hash(key, name[i]);
    }

    if (i == len) {
        return NULL;
    }

#if 0
    ngx_log_error(NGX_LOG_ALERT, ngx_cycle->log, 0, "key:\"%ui\"", key);
#endif

    value = ngx_hash_find(&hwc->hash, key, name, i);

#if 0
    ngx_log_error(NGX_LOG_ALERT, ngx_cycle->log, 0, "value:\"%p\"", value);
#endif

    if (value) {

        /*
         * the 2 low bits of value have the special meaning:
         *     00 - value is data pointer;
         *     11 - value is pointer to wildcard hash allowing "example.*".
         */

        if ((uintptr_t) value & 2) {

            i++;

            hwc = (ngx_hash_wildcard_t *) ((uintptr_t) value & (uintptr_t) ~3);

            value = ngx_hash_find_wc_tail(hwc, &name[i], len - i);

            if (value) {
                return value;
            }

            return hwc->value;
        }

        return value;
    }

    return hwc->value;
}